

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

FACTRPC * FACT_INTERNAL_GetRPC(FACTAudioEngine *engine,uint32_t code)

{
  uint32_t *puVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0x10;
  lVar3 = 0;
  do {
    if ((ulong)engine->rpcCount * 0x10 + lVar2 == 0x10) {
      return (FACTRPC *)0x0;
    }
    lVar2 = lVar2 + -0x10;
    puVar1 = (uint32_t *)((long)engine->rpcCodes + lVar3);
    lVar3 = lVar3 + 4;
  } while (*puVar1 != code);
  return (FACTRPC *)((long)engine->rpcs - lVar2);
}

Assistant:

FACTRPC* FACT_INTERNAL_GetRPC(
	FACTAudioEngine *engine,
	uint32_t code
) {
	uint16_t i;
	for (i = 0; i < engine->rpcCount; i += 1)
	{
		if (engine->rpcCodes[i] == code)
		{
			return &engine->rpcs[i];
		}
	}

	FAudio_assert(0 && "RPC code not found!");
	return NULL;
}